

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

void __thiscall
QWidgetRepaintManager::markNeedsFlush
          (QWidgetRepaintManager *this,QWidget *widget,QRegion *region,QPoint *topLevelOffset)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  QDebug *pQVar4;
  QWidget *parent;
  QWidget *in_RCX;
  QRegion *in_RDX;
  long in_RSI;
  QWidgetRepaintManager *in_RDI;
  long in_FS_OFFSET;
  QWidget *nativeParent;
  QPoint nativeParentOffset;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category;
  QWidgetPrivate *in_stack_fffffffffffffe68;
  QWidget *in_stack_fffffffffffffe70;
  QRegion *in_stack_fffffffffffffe78;
  QWidget *in_stack_fffffffffffffe88;
  QWidget *widget_00;
  char *in_stack_fffffffffffffeb8;
  QDebug local_130;
  QDebug local_128;
  QDebug local_120;
  QDebug in_stack_fffffffffffffee8;
  QDebug in_stack_fffffffffffffef0;
  QRegion local_108 [2];
  QPoint local_f8;
  QRegion local_f0 [5];
  QDebug local_c8;
  QDebug local_c0;
  QDebug local_b8;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  QDebug local_98;
  QDebug local_90;
  QDebug local_88 [5];
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    QWidget::d_func((QWidget *)0x3a5dcc);
    bVar2 = QWidgetPrivate::shouldPaintOnScreen(in_stack_fffffffffffffe68);
    if ((!bVar2) && (uVar3 = QRegion::isEmpty(), (uVar3 & 1) == 0)) {
      lVar1._0_4_ = *(int *)&in_RDI->tlw;
      lVar1._4_4_ = *(int *)((long)&in_RDI->tlw + 4);
      if (in_RSI == lVar1) {
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcWidgetPainting();
        anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)in_stack_fffffffffffffe70,
                   (QLoggingCategory *)in_stack_fffffffffffffe68);
        while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
          anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x3a5e56);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_RDI,(char *)in_stack_fffffffffffffe78,
                     (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                     (char *)in_stack_fffffffffffffe68,(char *)0x3a5e6f);
          QMessageLogger::info();
          pQVar4 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffe88,in_stack_fffffffffffffeb8)
          ;
          QDebug::QDebug(&local_58,pQVar4);
          ::operator<<((QDebug *)&local_50,(QRegion *)&local_58);
          pQVar4 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffe88,in_stack_fffffffffffffeb8)
          ;
          QDebug::QDebug(&local_48,pQVar4);
          ::operator<<((QDebug *)in_stack_fffffffffffffef0.stream,
                       (QWidget *)in_stack_fffffffffffffee8.stream);
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffe88,in_stack_fffffffffffffeb8);
          QDebug::~QDebug(&local_40);
          QDebug::~QDebug(&local_48);
          QDebug::~QDebug(&local_50);
          QDebug::~QDebug(&local_58);
          QDebug::~QDebug(&local_60);
          local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
        }
        QRegion::operator+=(&in_RDI->topLevelNeedsFlush,in_RDX);
      }
      else {
        bVar2 = hasPlatformWindow(in_stack_fffffffffffffe70);
        if ((bVar2) || (bVar2 = QWidget::isWindow(in_stack_fffffffffffffe70), bVar2)) {
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          local_30 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcWidgetPainting();
          anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)in_stack_fffffffffffffe70,
                     (QLoggingCategory *)in_stack_fffffffffffffe68);
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
            anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x3a62e9);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_RDI,(char *)in_stack_fffffffffffffe78,
                       (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       (char *)in_stack_fffffffffffffe68,(char *)0x3a62ff);
            QMessageLogger::info();
            pQVar4 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffe88,
                                        in_stack_fffffffffffffeb8);
            QDebug::QDebug(&local_128,pQVar4);
            ::operator<<((QDebug *)&local_120,(QRegion *)&local_128);
            pQVar4 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffe88,
                                        in_stack_fffffffffffffeb8);
            QDebug::QDebug((QDebug *)&stack0xfffffffffffffee8,pQVar4);
            ::operator<<((QDebug *)in_stack_fffffffffffffef0.stream,
                         (QWidget *)in_stack_fffffffffffffee8.stream);
            QDebug::operator<<((QDebug *)in_stack_fffffffffffffe88,in_stack_fffffffffffffeb8);
            QDebug::~QDebug((QDebug *)&stack0xfffffffffffffef0);
            QDebug::~QDebug((QDebug *)&stack0xfffffffffffffee8);
            QDebug::~QDebug(&local_120);
            QDebug::~QDebug(&local_128);
            QDebug::~QDebug(&local_130);
            local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
          }
          markNeedsFlush(in_RDI,in_stack_fffffffffffffe88,in_stack_fffffffffffffe78);
        }
        else {
          parent = QWidget::nativeParentWidget(in_stack_fffffffffffffe70);
          local_28 = &DAT_aaaaaaaaaaaaaaaa;
          local_20 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcWidgetPainting();
          anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)in_stack_fffffffffffffe70,
                     (QLoggingCategory *)in_stack_fffffffffffffe68);
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
            anon_unknown.dwarf_2950bb::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x3a6003);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_RDI,(char *)in_stack_fffffffffffffe78,
                       (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       (char *)in_stack_fffffffffffffe68,(char *)0x3a601c);
            QMessageLogger::info();
            pQVar4 = QDebug::operator<<((QDebug *)parent,in_stack_fffffffffffffeb8);
            QDebug::QDebug(&local_c0,pQVar4);
            ::operator<<((QDebug *)&local_b8,(QRegion *)&local_c0);
            pQVar4 = QDebug::operator<<((QDebug *)parent,in_stack_fffffffffffffeb8);
            QDebug::QDebug(&local_b0,pQVar4);
            ::operator<<((QDebug *)in_stack_fffffffffffffef0.stream,
                         (QWidget *)in_stack_fffffffffffffee8.stream);
            pQVar4 = QDebug::operator<<((QDebug *)parent,in_stack_fffffffffffffeb8);
            QDebug::QDebug(&local_a0,pQVar4);
            ::operator<<((QDebug *)in_stack_fffffffffffffef0.stream,
                         (QWidget *)in_stack_fffffffffffffee8.stream);
            pQVar4 = QDebug::operator<<((QDebug *)parent,in_stack_fffffffffffffeb8);
            QDebug::QDebug(&local_90,pQVar4);
            ::operator<<((QDebug *)local_88,(QPoint *)&local_90);
            QDebug::~QDebug(local_88);
            QDebug::~QDebug(&local_90);
            QDebug::~QDebug(&local_98);
            QDebug::~QDebug(&local_a0);
            QDebug::~QDebug(&local_a8);
            QDebug::~QDebug(&local_b0);
            QDebug::~QDebug(&local_b8);
            QDebug::~QDebug(&local_c0);
            QDebug::~QDebug(&local_c8);
            local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
          }
          if (parent == *(QWidget **)&in_RDI->tlw) {
            QRegion::translated((QRegion *)parent,(QPoint *)in_RDI);
            QRegion::operator+=(&in_RDI->topLevelNeedsFlush,(QRegion *)local_f0);
            QRegion::~QRegion(local_f0);
          }
          else {
            local_f8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            QPoint::QPoint((QPoint *)parent);
            local_f8 = QWidget::mapTo(in_RCX,parent,(QPoint *)in_RDI);
            widget_00 = parent;
            QRegion::translated((QRegion *)parent,(QPoint *)in_RDI);
            markNeedsFlush(in_RDI,widget_00,(QRegion *)parent);
            QRegion::~QRegion(local_108);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::markNeedsFlush(QWidget *widget, const QRegion &region, const QPoint &topLevelOffset)
{
    if (!widget || widget->d_func()->shouldPaintOnScreen() || region.isEmpty())
        return;

    if (widget == tlw) {
        // Top-level (native)
        qCInfo(lcWidgetPainting) << "Marking" << region << "of top level"
            << widget << "as needing flush";
        topLevelNeedsFlush += region;
    } else if (!hasPlatformWindow(widget) && !widget->isWindow()) {
        QWidget *nativeParent = widget->nativeParentWidget();
        qCInfo(lcWidgetPainting) << "Marking" << region << "of"
                << widget << "as needing flush in" << nativeParent
                << "at offset" << topLevelOffset;
        if (nativeParent == tlw) {
            // Alien widgets with the top-level as the native parent (common case)
            topLevelNeedsFlush += region.translated(topLevelOffset);
        } else {
            // Alien widgets with native parent != tlw
            const QPoint nativeParentOffset = widget->mapTo(nativeParent, QPoint());
            markNeedsFlush(nativeParent, region.translated(nativeParentOffset));
        }
    } else {
        // Native child widgets
        qCInfo(lcWidgetPainting) << "Marking" << region
            << "of native child" << widget << "as needing flush";
        markNeedsFlush(widget, region);
    }
}